

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O2

double alex::fanout_tree::compute_level<int,int,alex::AlexCompare>
                 (double expected_insert_frac,long values,int num_keys,long node,int total_keys,
                 vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 *used_fanout_tree_nodes,uint level,int max_data_node_keys,
                 bool approximate_model_computation,bool approximate_cost_computation)

{
  V *values_00;
  double dVar1;
  double dVar2;
  sbyte sVar3;
  uint uVar4;
  pair<int,_int> *ppVar5;
  long lVar6;
  int iVar7;
  int num_keys_00;
  long lVar8;
  int iVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 in_XMM3_Qb;
  double local_100;
  LinearModel<int> model;
  undefined8 local_90;
  double local_88;
  int iStack_80;
  int iStack_7c;
  ulong uStack_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  int iStack_50;
  DataNodeStats stats;
  
  uVar4 = 1 << (level & 0x1f);
  dVar11 = (double)(int)uVar4;
  dVar1 = dVar11 * *(double *)(node + 0x10);
  dVar2 = dVar11 * *(double *)(node + 0x18);
  sVar3 = ((byte)level < 0x21) * (' ' - (byte)level);
  lVar8 = (long)num_keys;
  uVar10 = 0;
  local_100 = 0.0;
  iVar7 = 0;
  do {
    if (uVar10 == (~((int)uVar4 >> 0x1f) & uVar4)) {
      return (dVar11 * 5e-07 * 208.0 * (double)total_keys) / (double)num_keys + 20.0 + local_100;
    }
    lVar6 = lVar8;
    iVar9 = num_keys;
    if (uVar10 != (uint)(-1 << sVar3) >> sVar3) {
      local_90 = ((double)(int)(uVar10 + 1) - dVar2) / dVar1;
      ppVar5 = std::
               __lower_bound<std::pair<int,int>const*,double,__gnu_cxx::__ops::_Iter_comp_val<alex::fanout_tree::compute_level<int,int,alex::AlexCompare>(std::pair<int,int>const*,int,alex::AlexNode<int,int>const*,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&,int,int,double,bool,bool,alex::AlexCompare)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                         (values,values + lVar8 * 8,&local_90);
      iVar9 = (int)((ulong)((long)ppVar5 - values) >> 3);
      lVar6 = (long)iVar9;
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar2;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar1;
    if (iVar9 <= num_keys) {
      iVar9 = num_keys;
    }
    for (; lVar6 < lVar8; lVar6 = lVar6 + 1) {
      auVar13._0_8_ = (double)*(int *)(values + lVar6 * 8);
      auVar13._8_8_ = in_XMM3_Qb;
      auVar13 = vfmadd213sd_fma(auVar13,auVar14,auVar15);
      if ((int)uVar10 < (int)auVar13._0_8_) {
        iVar9 = (int)lVar6;
        break;
      }
    }
    num_keys_00 = iVar9 - iVar7;
    if (num_keys_00 == 0) {
      uStack_68 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      uStack_58 = 0;
      uStack_54 = 0;
      iStack_50 = 0;
      local_88 = 0.0;
      uStack_78 = 0;
      uStack_70 = 0;
      uStack_6c = 0;
      iStack_7c = iVar7;
    }
    else {
      values_00 = (V *)(values + (long)iVar7 * 8);
      model.a_ = 0.0;
      model.b_ = 0.0;
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
      build_model(values_00,num_keys_00,&model,approximate_model_computation);
      stats.num_search_iterations = 0.0;
      stats.num_shifts = 0.0;
      dVar12 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
               ::compute_expected_cost
                         (values_00,num_keys_00,0.7,expected_insert_frac,&model,
                          approximate_cost_computation,&stats);
      local_88 = (double)((ulong)(max_data_node_keys < num_keys_00) * (long)(dVar12 + 20.0) +
                         (ulong)(num_keys_00 <= max_data_node_keys) * (long)dVar12);
      uStack_78 = uStack_78 & 0xffffffffffffff00;
      uStack_70 = SUB84(stats.num_search_iterations,0);
      uStack_6c = (undefined4)((ulong)stats.num_search_iterations >> 0x20);
      uStack_68 = SUB84(stats.num_shifts,0);
      uStack_64 = (undefined4)((ulong)stats.num_shifts >> 0x20);
      local_100 = local_100 + (local_88 * (double)num_keys_00) / (double)num_keys;
      uStack_60 = SUB84(model.a_,0);
      uStack_5c = (undefined4)((ulong)model.a_ >> 0x20);
      uStack_58 = SUB84(model.b_,0);
      uStack_54 = (undefined4)((ulong)model.b_ >> 0x20);
      iStack_50 = num_keys_00;
      iStack_7c = iVar9;
    }
    iStack_80 = iVar7;
    local_90 = (double)CONCAT44(uVar10,level);
    std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
    emplace_back<alex::fanout_tree::FTNode>(used_fanout_tree_nodes,(FTNode *)&local_90);
    uVar10 = uVar10 + 1;
    iVar7 = iVar9;
  } while( true );
}

Assistant:

double compute_level(const std::pair<T, P> values[], int num_keys,
                     const AlexNode<T, P>* node, int total_keys,
                     std::vector<FTNode>& used_fanout_tree_nodes, int level,
                     int max_data_node_keys, double expected_insert_frac = 0,
                     bool approximate_model_computation = true,
                     bool approximate_cost_computation = false,
                     Compare key_less = Compare()) {
  int fanout = 1 << level;
  double cost = 0.0;
  double a = node->model_.a_ * fanout;
  double b = node->model_.b_ * fanout;
  int left_boundary = 0;
  int right_boundary = 0;
  for (int i = 0; i < fanout; i++) {
    left_boundary = right_boundary;
    right_boundary =
        i == fanout - 1
            ? num_keys
            : static_cast<int>(
                  std::lower_bound(values, values + num_keys, ((i + 1) - b) / a,
                                   [key_less](auto const& a, auto const& b) {
                                     return key_less(a.first, b);
                                   }) -
                  values);
    // Account for off-by-one errors due to floating-point precision issues.
    while (right_boundary < num_keys &&
           static_cast<int>(a * values[right_boundary].first + b) <= i) {
      right_boundary++;
    }
    if (left_boundary == right_boundary) {
      used_fanout_tree_nodes.push_back(
          {level, i, 0, left_boundary, right_boundary, false, 0, 0, 0, 0, 0});
      continue;
    }
    LinearModel<T> model;
    AlexDataNode<T, P>::build_model(values + left_boundary,
                                    right_boundary - left_boundary, &model,
                                    approximate_model_computation);

    DataNodeStats stats;
    double node_cost = AlexDataNode<T, P>::compute_expected_cost(
        values + left_boundary, right_boundary - left_boundary,
        AlexDataNode<T, P>::kInitDensity_, expected_insert_frac, &model,
        approximate_cost_computation, &stats);
    // If the node is too big to be a data node, proactively incorporate an
    // extra tree traversal level into the cost.
    if (right_boundary - left_boundary > max_data_node_keys) {
      node_cost += kNodeLookupsWeight;
    }

    cost += node_cost * (right_boundary - left_boundary) / num_keys;

    used_fanout_tree_nodes.push_back(
        {level, i, node_cost, left_boundary, right_boundary, false,
         stats.num_search_iterations, stats.num_shifts, model.a_, model.b_,
         right_boundary - left_boundary});
  }
  double traversal_cost =
      kNodeLookupsWeight +
      (kModelSizeWeight * fanout *
       (sizeof(AlexDataNode<T, P>) + sizeof(void*)) * total_keys / num_keys);
  cost += traversal_cost;
  return cost;
}